

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O2

void __thiscall toml::detail::location::advance(location *this,size_t n)

{
  element_type *peVar1;
  ulong uVar2;
  
  peVar1 = (this->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar2 <= this->location_ + n) {
    n = uVar2 - this->location_;
  }
  advance_impl(this,n);
  return;
}

Assistant:

TOML11_INLINE void location::advance(std::size_t n) noexcept
{
    assert(this->is_ok());
    if(this->location_ + n < this->source_->size())
    {
        this->advance_impl(n);
    }
    else
    {
        this->advance_impl(this->source_->size() - this->location_);

        assert(this->location_ == this->source_->size());
    }
}